

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int unqlite_create_constant
              (unqlite_vm *pVm,char *zName,_func_void_unqlite_value_ptr_void_ptr *xExpand,
              void *pUserData)

{
  char cVar1;
  char *pcVar2;
  sxi32 sVar3;
  char *pcVar4;
  ushort **ppuVar5;
  byte bVar6;
  uint uVar7;
  bool bVar8;
  SyString sName;
  SyString local_48;
  void *local_38;
  
  sVar3 = -0x18;
  if ((pVm != (unqlite_vm *)0x0) && (pVm->nMagic != 0xdead2bad)) {
    pcVar4 = zName;
    if (*zName != '\0') {
      pcVar2 = zName + 2;
      do {
        pcVar4 = pcVar2;
        if (pcVar4[-1] == '\0') {
          pcVar4 = pcVar4 + -1;
          goto LAB_0010c600;
        }
        if (*pcVar4 == '\0') goto LAB_0010c600;
        if (pcVar4[1] == '\0') {
          pcVar4 = pcVar4 + 1;
          goto LAB_0010c600;
        }
        pcVar2 = pcVar4 + 4;
      } while (pcVar4[2] != '\0');
      pcVar4 = pcVar4 + 2;
    }
LAB_0010c600:
    uVar7 = (int)pcVar4 - (int)zName;
    local_48.zString = zName;
    local_48.nByte = uVar7;
    local_38 = pUserData;
    if (uVar7 != 0) {
      do {
        cVar1 = *zName;
        if ((0xffffffffffffffbf < (ulong)(long)cVar1) ||
           (ppuVar5 = __ctype_b_loc(), (*(byte *)((long)*ppuVar5 + (long)cVar1 * 2 + 1) & 0x20) == 0
           )) goto LAB_0010c638;
        zName = zName + 1;
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
      uVar7 = 0;
    }
LAB_0010c638:
    bVar8 = uVar7 == 0;
    local_48.zString = zName;
    if ((!bVar8) && (bVar6 = zName[uVar7 - 1], bVar6 < 0xc0)) {
      local_48.nByte = uVar7;
      ppuVar5 = __ctype_b_loc();
      do {
        if ((*(byte *)((long)*ppuVar5 + (long)(char)bVar6 * 2 + 1) & 0x20) == 0) break;
        bVar8 = uVar7 == 1;
        if (bVar8) {
          uVar7 = 0;
          break;
        }
        bVar6 = zName[uVar7 - 2];
        uVar7 = uVar7 - 1;
      } while (bVar6 < 0xc0);
    }
    sVar3 = -9;
    if ((xExpand != (_func_void_unqlite_value_ptr_void_ptr *)0x0) && (!bVar8)) {
      local_48.nByte = uVar7;
      sVar3 = jx9VmRegisterConstant(pVm->pJx9Vm,&local_48,(ProcConstant)xExpand,local_38);
    }
  }
  return sVar3;
}

Assistant:

int unqlite_create_constant(unqlite_vm *pVm,const char *zName,void (*xExpand)(unqlite_value *, void *),void *pUserData)
{
	SyString sName;
	int rc;
	if( UNQLITE_VM_MISUSE(pVm) ){
		return UNQLITE_CORRUPT;
	}
	SyStringInitFromBuf(&sName, zName, SyStrlen(zName));
	/* Remove leading and trailing white spaces */
	SyStringFullTrim(&sName);
	if( sName.nByte < 1 ){
		/* Empty constant name */
		return UNQLITE_INVALID;
	}
	/* TICKET 1433-003: NULL pointer is harmless operation */
	if( xExpand == 0 ){
		return UNQLITE_INVALID;
	}
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Acquire VM mutex */
	 SyMutexEnter(sUnqlMPGlobal.pMutexMethods, pVm->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
	 if( sUnqlMPGlobal.nThreadingLevel > UNQLITE_THREAD_LEVEL_SINGLE && 
		 UNQLITE_THRD_VM_RELEASE(pVm) ){
			 return UNQLITE_ABORT; /* Another thread have released this instance */
	 }
#endif
	 /* Install the foreign constant */
	 rc = jx9VmRegisterConstant(pVm->pJx9Vm,&sName,xExpand,pUserData);
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Leave DB mutex */
	 SyMutexLeave(sUnqlMPGlobal.pMutexMethods,pVm->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
#endif
	return rc;
}